

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entenc.h
# Opt level: O0

void write_enc_data_to_out_buf
               (uchar *out,uint32_t offs,uint64_t output,uint64_t carry,uint32_t *enc_offs,
               uint8_t num_bytes_ready)

{
  uint64_t uVar1;
  long in_RCX;
  long in_RDX;
  uint in_ESI;
  uchar *in_RDI;
  int *in_R8;
  byte in_R9B;
  uint64_t reg;
  
  uVar1 = BSwap64(in_RDX << (('\b' - in_R9B) * '\b' & 0x3f));
  *(uint64_t *)(in_RDI + in_ESI) = uVar1;
  if (in_RCX != 0) {
    propagate_carry_bwd(in_RDI,in_ESI - 1);
  }
  *in_R8 = in_ESI + in_R9B;
  return;
}

Assistant:

static inline void write_enc_data_to_out_buf(unsigned char *out, uint32_t offs,
                                             uint64_t output, uint64_t carry,
                                             uint32_t *enc_offs,
                                             uint8_t num_bytes_ready) {
  const uint64_t reg = HToBE64(output << ((8 - num_bytes_ready) << 3));
  memcpy(&out[offs], &reg, 8);
  // Propagate carry backwards if exists
  if (carry) {
    assert(offs > 0);
    propagate_carry_bwd(out, offs - 1);
  }
  *enc_offs = offs + num_bytes_ready;
}